

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniDFS.cpp
# Opt level: O2

void __thiscall NameServer::loadMeta(NameServer *this)

{
  string currenetId;
  text_iarchive block_server_ov;
  text_iarchive file_len_ov;
  text_iarchive file_block_ov;
  text_iarchive id_file_ov;
  ifstream id_file_meta;
  byte abStack_a10 [488];
  ifstream currentId_meta;
  ifstream block_server_meta;
  ifstream file_len_meta;
  ifstream file_block_meta;
  
  std::ifstream::ifstream(&id_file_meta,"dfsfiles/namenode/id-logicpath-meta",_S_in);
  if ((abStack_a10[*(long *)(_id_file_meta + -0x18)] & 5) == 0) {
    boost::archive::text_iarchive::text_iarchive(&id_file_ov,(istream *)&id_file_meta,0);
    boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
    invoke<std::map<int,std::pair<std::__cxx11::string,long_long>,std::less<int>,std::allocator<std::pair<int_const,std::pair<std::__cxx11::string,long_long>>>>>
              (&id_file_ov,&fileid_path_lenMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream(&file_block_meta,"dfsfiles/namenode/logicpath-blocks-meta",_S_in);
    boost::archive::text_iarchive::text_iarchive(&file_block_ov,(istream *)&file_block_meta,0);
    boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
    invoke<std::map<std::__cxx11::string,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>>
              (&file_block_ov,&logicFile_BlockFileMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream(&file_len_meta,"dfsfiles/namenode/logicpath-len-meta",_S_in);
    boost::archive::text_iarchive::text_iarchive(&file_len_ov,(istream *)&file_len_meta,0);
    boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
    invoke<std::map<std::__cxx11::string,long_long,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,long_long>>>>
              (&file_len_ov,&path_lenMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream(&block_server_meta,"dfsfiles/namenode/block-servers-meta",_S_in);
    boost::archive::text_iarchive::text_iarchive(&block_server_ov,(istream *)&block_server_meta,0);
    boost::archive::detail::load_non_pointer_type<boost::archive::text_iarchive>::load_standard::
    invoke<std::map<std::__cxx11::string,std::vector<int,std::allocator<int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<int,std::allocator<int>>>>>>
              (&block_server_ov,&block_serversMap_abi_cxx11_);
    std::ifstream::close();
    std::ifstream::ifstream(&currentId_meta,"dfsfiles/namenode/current-id-meta",_S_in);
    currenetId._M_dataplus._M_p = (pointer)&currenetId.field_2;
    currenetId._M_string_length = 0;
    currenetId.field_2._M_local_buf[0] = '\0';
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&currentId_meta,(string *)&currenetId);
    fileID = std::__cxx11::stoi(&currenetId,(size_t *)0x0,10);
    std::ifstream::close();
    std::__cxx11::string::~string((string *)&currenetId);
    std::ifstream::~ifstream(&currentId_meta);
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&block_server_ov.super_text_iarchive_impl<boost::archive::text_iarchive>);
    std::ifstream::~ifstream(&block_server_meta);
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&file_len_ov.super_text_iarchive_impl<boost::archive::text_iarchive>);
    std::ifstream::~ifstream(&file_len_meta);
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&file_block_ov.super_text_iarchive_impl<boost::archive::text_iarchive>);
    std::ifstream::~ifstream(&file_block_meta);
    boost::archive::text_iarchive_impl<boost::archive::text_iarchive>::~text_iarchive_impl
              (&id_file_ov.super_text_iarchive_impl<boost::archive::text_iarchive>);
  }
  std::ifstream::~ifstream(&id_file_meta);
  return;
}

Assistant:

void loadMeta() const
    {
        ifstream id_file_meta("dfsfiles/namenode/id-logicpath-meta");
        if(!id_file_meta)
        {
            return;
        }
        boost::archive::text_iarchive id_file_ov(id_file_meta);
        id_file_ov >> fileid_path_lenMap;
        id_file_meta.close();

        ifstream file_block_meta("dfsfiles/namenode/logicpath-blocks-meta");
        boost::archive::text_iarchive file_block_ov(file_block_meta);
        file_block_ov >> logicFile_BlockFileMap;
        file_block_meta.close();

        ifstream file_len_meta("dfsfiles/namenode/logicpath-len-meta");
        boost::archive::text_iarchive file_len_ov(file_len_meta);
        file_len_ov >> path_lenMap;
        file_len_meta.close();

        ifstream block_server_meta("dfsfiles/namenode/block-servers-meta");
        boost::archive::text_iarchive block_server_ov(block_server_meta);
        block_server_ov >> block_serversMap;
        block_server_meta.close();

        ifstream currentId_meta("dfsfiles/namenode/current-id-meta");
        string currenetId;
        getline(currentId_meta, currenetId);
        fileID = stoi(currenetId);
        currentId_meta.close();

    }